

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Promise<unsigned_long> __thiscall
kj::anon_unknown_77::AsyncPipe::BlockedPumpFrom::pumpTo
          (BlockedPumpFrom *this,AsyncOutputStream *output,uint64_t amount2)

{
  bool bVar1;
  Exception *in_RCX;
  PromiseNode *extraout_RDX;
  Promise<unsigned_long> PVar2;
  AsyncOutputStream *local_90;
  uint64_t local_88;
  Exception *local_80;
  WiderType<Decay<unsigned_long_&>,_Decay<unsigned_long>_> local_78;
  undefined1 local_70 [32];
  unsigned_long local_50;
  WiderType<Decay<unsigned_long_&>,_Decay<unsigned_long>_> local_48;
  WiderType<Decay<unsigned_long_&>,_Decay<unsigned_long>_> n;
  Fault local_30;
  Fault f;
  uint64_t amount2_local;
  AsyncOutputStream *output_local;
  BlockedPumpFrom *this_local;
  
  f.exception = in_RCX;
  bVar1 = Canceler::isEmpty((Canceler *)(output + 7));
  if (!bVar1) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[16]>
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
               ,0x20f,FAILED,"canceler.isEmpty()","\"already pumping\"",
               (char (*) [16])"already pumping");
    _::Debug::Fault::fatal(&local_30);
  }
  local_50 = (long)output[5]._vptr_AsyncOutputStream - (long)output[6]._vptr_AsyncOutputStream;
  local_48 = min<unsigned_long&,unsigned_long>((unsigned_long *)&f,&local_50);
  (**(code **)(*output[4]._vptr_AsyncOutputStream + 0x18))
            ((Type *)local_70,output[4]._vptr_AsyncOutputStream,amount2,local_48);
  local_80 = f.exception;
  local_78 = local_48;
  local_90 = output;
  local_88 = amount2;
  Promise<unsigned_long>::
  then<kj::(anonymous_namespace)::AsyncPipe::BlockedPumpFrom::pumpTo(kj::AsyncOutputStream&,unsigned_long)::_lambda(unsigned_long)_1_,kj::_::PropagateException>
            ((Promise<unsigned_long> *)(local_70 + 0x10),(Type *)local_70,
             (PropagateException *)&local_90);
  Canceler::wrap<unsigned_long>((Canceler *)this,(Promise<unsigned_long> *)(output + 7));
  Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)(local_70 + 0x10));
  Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)local_70);
  PVar2.super_PromiseBase.node.ptr = extraout_RDX;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<unsigned_long>)PVar2.super_PromiseBase.node;
}

Assistant:

Promise<uint64_t> pumpTo(AsyncOutputStream& output, uint64_t amount2) override {
      KJ_REQUIRE(canceler.isEmpty(), "already pumping");

      auto n = kj::min(amount2, amount - pumpedSoFar);
      return canceler.wrap(input.pumpTo(output, n)
          .then([this,&output,amount2,n](uint64_t actual) -> Promise<uint64_t> {
        canceler.release();
        pumpedSoFar += actual;
        KJ_ASSERT(pumpedSoFar <= amount);
        if (pumpedSoFar == amount || actual < n) {
          // Either we pumped all we wanted or we hit EOF.
          fulfiller.fulfill(kj::cp(pumpedSoFar));
          pipe.endState(*this);
          return pipe.pumpTo(output, amount2 - actual)
              .then([actual](uint64_t actual2) { return actual + actual2; });
        }

        // Completed entire pumpTo amount.
        KJ_ASSERT(actual == amount2);
        return amount2;
      }));
    }